

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-kill.c
# Opt level: O3

char * borg_race_name(wchar_t r_idx)

{
  if (r_idx == L'\0') {
    return "dead monster";
  }
  if (r_idx < (uint)z_info->r_max + L'\xffffffff') {
    return r_info[r_idx].name;
  }
  return "player ghost";
}

Assistant:

const char *borg_race_name(int r_idx)
{
    /* Paranoia */
    if (!r_idx)
        return "dead monster";

    /* "player ghosts" */
    if (r_idx >= z_info->r_max - 1)
        return "player ghost";

    return r_info[r_idx].name;
}